

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O2

void __thiscall cmCoreTryCompile::CleanupFiles(cmCoreTryCompile *this,string *binDir)

{
  cmMakefile *this_00;
  bool bVar1;
  unsigned_long uVar2;
  char *pcVar3;
  size_t sVar4;
  string *psVar5;
  long lVar6;
  ulong dindex;
  string_view prefix;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar7;
  string_view str;
  Directory dir;
  string fullPath;
  Status status;
  cmAlphaNum local_100;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deletedFiles;
  string local_a0;
  cmAlphaNum local_80;
  string local_50;
  
  if (binDir->_M_string_length != 0) {
    bVar1 = IsTemporary(binDir);
    if (bVar1) {
      cmsys::Directory::Directory(&dir);
      cmsys::Directory::Load(&dir,binDir,(string *)0x0);
      deletedFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &deletedFiles._M_t._M_impl.super__Rb_tree_header._M_header;
      deletedFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      deletedFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      deletedFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      deletedFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           deletedFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (dindex = 0; uVar2 = cmsys::Directory::GetNumberOfFiles(&dir), dindex < uVar2;
          dindex = dindex + 1) {
        pcVar3 = cmsys::Directory::GetFile(&dir,dindex);
        if ((*pcVar3 != '.') || ((pcVar3[1] != '\0' && ((pcVar3[1] != '.' || (pcVar3[2] != '\0')))))
           ) {
          sVar4 = strlen(pcVar3);
          prefix._M_str = ".nfs";
          prefix._M_len = 4;
          str._M_str = pcVar3;
          str._M_len = sVar4;
          bVar1 = cmHasPrefix(str,prefix);
          if (!bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_100,pcVar3,(allocator<char> *)&local_80);
            pVar7 = std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)&deletedFiles,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_100);
            std::__cxx11::string::~string((string *)&local_100);
            if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              std::__cxx11::string::string((string *)&local_100,(string *)binDir);
              pcVar3 = (char *)std::__cxx11::string::append((char *)&local_100);
              psVar5 = (string *)std::__cxx11::string::append(pcVar3);
              std::__cxx11::string::string((string *)&fullPath,psVar5);
              std::__cxx11::string::~string((string *)&local_100);
              bVar1 = cmsys::SystemTools::FileIsSymlink(&fullPath);
              if (bVar1) {
                cmsys::SystemTools::RemoveFile(&fullPath);
              }
              else {
                bVar1 = cmsys::SystemTools::FileIsDirectory(&fullPath);
                if (bVar1) {
                  CleanupFiles(this,&fullPath);
                  cmsys::SystemTools::RemoveADirectory(&fullPath);
                }
                else {
                  status = cmsys::SystemTools::RemoveFile(&fullPath);
                  if (status.Kind_ != Success) {
                    this_00 = this->Makefile;
                    local_100.View_._M_len = 0xc;
                    local_100.View_._M_str = "The file:\n  ";
                    local_80.View_._M_len = fullPath._M_string_length;
                    local_80.View_._M_str = fullPath._M_dataplus._M_p;
                    cmsys::Status::GetString_abi_cxx11_(&local_a0,&status);
                    cmStrCat<char[26],std::__cxx11::string>
                              (&local_50,&local_100,&local_80,
                               (char (*) [26])"\ncould not be removed:\n  ",&local_a0);
                    cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_50);
                    std::__cxx11::string::~string((string *)&local_50);
                    std::__cxx11::string::~string((string *)&local_a0);
                  }
                }
              }
              std::__cxx11::string::~string((string *)&fullPath);
            }
          }
        }
      }
      lVar6 = std::__cxx11::string::find((char *)binDir,0x597aee);
      if (lVar6 != -1) {
        cmsys::SystemTools::RemoveADirectory(binDir);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&deletedFiles._M_t);
      cmsys::Directory::~Directory(&dir);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100
                     ,
                     "TRY_COMPILE attempt to remove -rf directory that does not contain CMakeTmp or CMakeScratch: \""
                     ,binDir);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &deletedFiles,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100
                     ,"\"");
      cmSystemTools::Error((string *)&deletedFiles);
      std::__cxx11::string::~string((string *)&deletedFiles);
      std::__cxx11::string::~string((string *)&local_100);
    }
  }
  return;
}

Assistant:

void cmCoreTryCompile::CleanupFiles(std::string const& binDir)
{
  if (binDir.empty()) {
    return;
  }

  if (!IsTemporary(binDir)) {
    cmSystemTools::Error(
      "TRY_COMPILE attempt to remove -rf directory that does not contain "
      "CMakeTmp or CMakeScratch: \"" +
      binDir + "\"");
    return;
  }

  cmsys::Directory dir;
  dir.Load(binDir);
  std::set<std::string> deletedFiles;
  for (unsigned long i = 0; i < dir.GetNumberOfFiles(); ++i) {
    const char* fileName = dir.GetFile(i);
    if (strcmp(fileName, ".") != 0 && strcmp(fileName, "..") != 0 &&
        // Do not delete NFS temporary files.
        !cmHasPrefix(fileName, ".nfs")) {
      if (deletedFiles.insert(fileName).second) {
        std::string const fullPath =
          std::string(binDir).append("/").append(fileName);
        if (cmSystemTools::FileIsSymlink(fullPath)) {
          cmSystemTools::RemoveFile(fullPath);
        } else if (cmSystemTools::FileIsDirectory(fullPath)) {
          this->CleanupFiles(fullPath);
          cmSystemTools::RemoveADirectory(fullPath);
        } else {
#ifdef _WIN32
          // Sometimes anti-virus software hangs on to new files so we
          // cannot delete them immediately.  Try a few times.
          cmSystemTools::WindowsFileRetry retry =
            cmSystemTools::GetWindowsFileRetry();
          cmsys::Status status;
          while (!((status = cmSystemTools::RemoveFile(fullPath))) &&
                 --retry.Count && cmSystemTools::FileExists(fullPath)) {
            cmSystemTools::Delay(retry.Delay);
          }
          if (retry.Count == 0)
#else
          cmsys::Status status = cmSystemTools::RemoveFile(fullPath);
          if (!status)
#endif
          {
            this->Makefile->IssueMessage(
              MessageType::FATAL_ERROR,
              cmStrCat("The file:\n  ", fullPath,
                       "\ncould not be removed:\n  ", status.GetString()));
          }
        }
      }
    }
  }

  if (binDir.find("CMakeScratch") != std::string::npos) {
    cmSystemTools::RemoveADirectory(binDir);
  }
}